

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall
Catch::CumulativeReporterBase::BySectionInfo::operator()
          (BySectionInfo *this,Ptr<Catch::CumulativeReporterBase::SectionNode> *node)

{
  bool bVar1;
  
  bVar1 = SourceLineInfo::operator==
                    (&(node->m_p->stats).sectionInfo.lineInfo,&this->m_other->lineInfo);
  return bVar1;
}

Assistant:

T* operator->() const { return m_p; }